

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_context.cpp
# Opt level: O3

void __thiscall
TransactionContext_Input_Output_Test::TestBody(TransactionContext_Input_Output_Test *this)

{
  AssertHelperData *pAVar1;
  ByteData *pBVar2;
  undefined8 uVar3;
  uint32_t *puVar4;
  uint64_t uVar5;
  bool bVar6;
  uint32_t uVar7;
  _func_int **pp_Var8;
  char *pcVar9;
  _func_int *p_Var10;
  uint *lhs;
  AssertionResult gtest_ar_4;
  value_type_conflict2 *__val;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> ref_list;
  AssertionResult gtest_ar_15;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  UtxoData utxo_stub;
  TransactionContext ctx;
  Address address1;
  Address address2;
  UtxoData utxo3;
  UtxoData utxo4;
  UtxoData utxo2;
  UtxoData utxo1;
  undefined1 local_1d50 [32];
  undefined1 local_1d30 [56];
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> local_1cf8;
  uint32_t *local_1ce0;
  undefined1 local_1cd8 [32];
  internal local_1cb8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1cb0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_1ca8;
  UtxoData local_1c88;
  TransactionContext local_1798;
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [16];
  pointer local_16b0;
  pointer local_1698;
  pointer local_1680;
  TapBranch local_1668;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_15f0;
  Script local_15d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1598;
  Address local_1568;
  UtxoData local_13f0;
  UtxoData local_f00;
  UtxoData local_a10;
  UtxoData local_520;
  
  cfd::UtxoData::UtxoData(&local_520);
  pBVar2 = &local_13f0.block_hash.data_;
  local_13f0.block_height = (uint64_t)pBVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_13f0,
             "9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a","");
  cfd::core::Txid::Txid((Txid *)&local_a10,(string *)&local_13f0);
  cfd::core::Txid::operator=(&local_520.txid,(Txid *)&local_a10);
  local_a10.block_height = (uint64_t)&PTR__Txid_00723450;
  if (local_a10.block_hash._vptr_BlockHash != (_func_int **)0x0) {
    operator_delete(local_a10.block_hash._vptr_BlockHash);
  }
  if ((ByteData *)local_13f0.block_height != pBVar2) {
    operator_delete((void *)local_13f0.block_height);
  }
  local_520.vout = 1;
  local_520.address_type = kP2wpkhAddress;
  cfd::UtxoData::UtxoData(&local_a10);
  pBVar2 = &local_f00.block_hash.data_;
  local_f00.block_height = (uint64_t)pBVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f00,"8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a"
             ,"");
  cfd::core::Txid::Txid((Txid *)&local_13f0,(string *)&local_f00);
  cfd::core::Txid::operator=(&local_a10.txid,(Txid *)&local_13f0);
  local_13f0.block_height = (uint64_t)&PTR__Txid_00723450;
  if (local_13f0.block_hash._vptr_BlockHash != (_func_int **)0x0) {
    operator_delete(local_13f0.block_hash._vptr_BlockHash);
  }
  if ((ByteData *)local_f00.block_height != pBVar2) {
    operator_delete((void *)local_f00.block_height);
  }
  local_a10.vout = 2;
  local_a10.address_type = kP2wpkhAddress;
  cfd::UtxoData::UtxoData(&local_13f0);
  pBVar2 = &local_1c88.block_hash.data_;
  local_1c88.block_height = (uint64_t)pBVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c88,
             "b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b","");
  cfd::core::Txid::Txid((Txid *)&local_f00,(string *)&local_1c88);
  cfd::core::Txid::operator=(&local_13f0.txid,(Txid *)&local_f00);
  local_f00.block_height = (uint64_t)&PTR__Txid_00723450;
  if (local_f00.block_hash._vptr_BlockHash != (_func_int **)0x0) {
    operator_delete(local_f00.block_hash._vptr_BlockHash);
  }
  if ((ByteData *)local_1c88.block_height != pBVar2) {
    operator_delete((void *)local_1c88.block_height);
  }
  local_13f0.vout = 3;
  local_13f0.address_type = kP2wpkhAddress;
  cfd::UtxoData::UtxoData(&local_f00);
  local_16e0._0_8_ = local_16e0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16e0,"0f093988839178ea5895431241cb4400fb31dd7b665a1a93cbd372336c717e0c"
             ,"");
  cfd::core::Txid::Txid((Txid *)&local_1c88,(string *)local_16e0);
  cfd::core::Txid::operator=(&local_f00.txid,(Txid *)&local_1c88);
  local_1c88.block_height = (uint64_t)&PTR__Txid_00723450;
  if (local_1c88.block_hash._vptr_BlockHash != (_func_int **)0x0) {
    operator_delete(local_1c88.block_hash._vptr_BlockHash);
  }
  if ((undefined1 *)local_16e0._0_8_ != local_16e0 + 0x10) {
    operator_delete((void *)local_16e0._0_8_);
  }
  local_f00.vout = 4;
  local_f00.address_type = kP2wpkhAddress;
  local_1ca8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1ca8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1ca8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back(&local_1ca8,&local_13f0);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back(&local_1ca8,&local_f00);
  cfd::TransactionContext::TransactionContext(&local_1798,2,0);
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    bVar6 = testing::internal::AlwaysTrue();
    if (bVar6) {
      cfd::TransactionContext::AddInput(&local_1798,&local_520);
    }
  }
  else {
    testing::Message::Message((Message *)&local_1c88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_16e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x129,
               "Expected: ctx.AddInput(utxo1) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_16e0,(Message *)&local_1c88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_16e0);
    if ((undefined **)local_1c88.block_height != (undefined **)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((undefined **)local_1c88.block_height != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_1c88.block_height + 8))();
      }
    }
  }
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    bVar6 = testing::internal::AlwaysTrue();
    if (bVar6) {
      cfd::TransactionContext::AddInput(&local_1798,&local_a10,0xf0ffffff);
    }
  }
  else {
    testing::Message::Message((Message *)&local_1c88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_16e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x12a,
               "Expected: ctx.AddInput(utxo2, 0xf0ffffff) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_16e0,(Message *)&local_1c88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_16e0);
    if ((undefined **)local_1c88.block_height != (undefined **)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((undefined **)local_1c88.block_height != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_1c88.block_height + 8))();
      }
    }
  }
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    bVar6 = testing::internal::AlwaysTrue();
    if (bVar6) {
      cfd::TransactionContext::AddInputs(&local_1798,&local_1ca8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_1c88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_16e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,299,
               "Expected: ctx.AddInputs(utxos) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_16e0,(Message *)&local_1c88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_16e0);
    if ((undefined **)local_1c88.block_height != (undefined **)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((undefined **)local_1c88.block_height != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_1c88.block_height + 8))();
      }
    }
  }
  local_1ce0 = (uint32_t *)operator_new(8);
  local_1ce0[0] = 0;
  local_1ce0[1] = 0;
  local_1c88.block_height = (uint64_t)pBVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c88,"3K4cCA6U45jhvBcgc8qEdjHGDGyUMuVRpG","");
  cfd::core::Address::Address((Address *)local_16e0,(string *)&local_1c88);
  if ((ByteData *)local_1c88.block_height != pBVar2) {
    operator_delete((void *)local_1c88.block_height);
  }
  local_1c88.block_height = (uint64_t)pBVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c88,"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q","");
  cfd::core::Address::Address(&local_1568,(string *)&local_1c88);
  if ((ByteData *)local_1c88.block_height != pBVar2) {
    operator_delete((void *)local_1c88.block_height);
  }
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    bVar6 = testing::internal::AlwaysTrue();
    if (bVar6) {
      cfd::core::Amount::Amount((Amount *)&local_1c88,0.1);
      uVar7 = cfd::TransactionContext::AddTxOut
                        (&local_1798,(Address *)local_16e0,(Amount *)&local_1c88);
      *local_1ce0 = uVar7;
    }
  }
  else {
    testing::Message::Message((Message *)&local_1c88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1d30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x12f,
               "Expected: indexes[0] = ctx.AddTxOut(address1, Amount(0.1)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1d30,(Message *)&local_1c88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d30);
    if ((ByteData *)local_1c88.block_height != (ByteData *)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((ByteData *)local_1c88.block_height != (ByteData *)0x0)) {
        (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      local_1c88.block_height)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + 8))();
      }
    }
  }
  bVar6 = testing::internal::AlwaysTrue();
  lhs = local_1ce0 + 1;
  if (bVar6) {
    bVar6 = testing::internal::AlwaysTrue();
    if (bVar6) {
      cfd::core::Amount::Amount((Amount *)&local_1c88,0.01);
      uVar7 = cfd::TransactionContext::AddTxOut(&local_1798,&local_1568,(Amount *)&local_1c88);
      *lhs = uVar7;
    }
  }
  else {
    testing::Message::Message((Message *)&local_1c88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1d30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x130,
               "Expected: indexes[1] = ctx.AddTxOut(address2, Amount(0.01)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1d30,(Message *)&local_1c88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d30);
    if ((ByteData *)local_1c88.block_height != (ByteData *)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((ByteData *)local_1c88.block_height != (ByteData *)0x0)) {
        (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      local_1c88.block_height)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + 8))();
      }
    }
  }
  local_1d30._0_4_ = cfd::core::Transaction::GetTxInCount(&local_1798.super_Transaction);
  local_1d50._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_1c88,"ctx.GetTxInCount()","4",(uint *)local_1d30,(int *)local_1d50);
  if ((char)local_1c88.block_height == '\0') {
    testing::Message::Message((Message *)local_1d30);
    if (local_1c88.block_hash._vptr_BlockHash == (_func_int **)0x0) {
      p_Var10 = (_func_int *)0x616d8d;
    }
    else {
      p_Var10 = *local_1c88.block_hash._vptr_BlockHash;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1d50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x132,(char *)p_Var10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1d50,(Message *)local_1d30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d50);
    if ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_1d30._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1c88.block_hash,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar7 = cfd::core::Transaction::GetTxOutCount(&local_1798.super_Transaction);
  local_1d30._0_4_ = uVar7;
  local_1d50._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_1c88,"ctx.GetTxOutCount()","2",(uint *)local_1d30,(int *)local_1d50)
  ;
  if ((char)local_1c88.block_height == '\0') {
    testing::Message::Message((Message *)local_1d30);
    if (local_1c88.block_hash._vptr_BlockHash == (_func_int **)0x0) {
      p_Var10 = (_func_int *)0x616d8d;
    }
    else {
      p_Var10 = *local_1c88.block_hash._vptr_BlockHash;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1d50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x133,(char *)p_Var10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1d50,(Message *)local_1d30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d50);
    if ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_1d30._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1c88.block_hash,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar7 = cfd::TransactionContext::GetSizeIgnoreTxIn(&local_1798,true);
  local_1d30._0_4_ = uVar7;
  local_1d50._0_4_ = 0x4b;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_1c88,"ctx.GetSizeIgnoreTxIn()","75",(uint *)local_1d30,
             (int *)local_1d50);
  if ((char)local_1c88.block_height == '\0') {
    testing::Message::Message((Message *)local_1d30);
    if (local_1c88.block_hash._vptr_BlockHash == (_func_int **)0x0) {
      p_Var10 = (_func_int *)0x616d8d;
    }
    else {
      p_Var10 = *local_1c88.block_hash._vptr_BlockHash;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1d50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x134,(char *)p_Var10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1d50,(Message *)local_1d30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d50);
    if ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_1d30._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1c88.block_hash,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar7 = cfd::TransactionContext::GetVsizeIgnoreTxIn(&local_1798,true);
  local_1d30._0_4_ = uVar7;
  local_1d50._0_4_ = 0x4b;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_1c88,"ctx.GetVsizeIgnoreTxIn()","75",(uint *)local_1d30,
             (int *)local_1d50);
  if ((char)local_1c88.block_height == '\0') {
    testing::Message::Message((Message *)local_1d30);
    if (local_1c88.block_hash._vptr_BlockHash == (_func_int **)0x0) {
      p_Var10 = (_func_int *)0x616d8d;
    }
    else {
      p_Var10 = *local_1c88.block_hash._vptr_BlockHash;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1d50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x135,(char *)p_Var10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1d50,(Message *)local_1d30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d50);
    if ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_1d30._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1c88.block_hash,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar7 = cfd::core::Transaction::GetTxInCount(&local_1798.super_Transaction);
  if (uVar7 == 4) {
    cfd::core::Transaction::GetTxInList
              ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
               local_1cd8,&local_1798.super_Transaction);
    cfd::core::Txid::Txid((Txid *)local_1d30,(Txid *)(local_1cd8._0_8_ + 8));
    cfd::core::Txid::GetHex_abi_cxx11_((string *)&local_1c88,(Txid *)local_1d30);
    uVar5 = local_1c88.block_height;
    cfd::core::Txid::GetHex_abi_cxx11_((string *)local_1d50,&local_520.txid);
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_1cf8,"ref_list[0].GetTxid().GetHex().c_str()",
               "utxo1.txid.GetHex().c_str()",(char *)uVar5,(char *)local_1d50._0_8_);
    pAVar1 = (AssertHelperData *)(local_1d50 + 0x10);
    if ((AssertHelperData *)local_1d50._0_8_ != pAVar1) {
      operator_delete((void *)local_1d50._0_8_);
    }
    if ((ByteData *)local_1c88.block_height != pBVar2) {
      operator_delete((void *)local_1c88.block_height);
    }
    local_1d30._0_8_ = &PTR__Txid_00723450;
    if ((void *)CONCAT71(local_1d30._9_7_,local_1d30[8]) != (void *)0x0) {
      operator_delete((void *)CONCAT71(local_1d30._9_7_,local_1d30[8]));
    }
    if (local_1cf8.
        super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>.
        _M_impl.super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_1c88);
      if (local_1cf8.
          super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>.
          _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        pp_Var8 = (_func_int **)0x616d8d;
      }
      else {
        pp_Var8 = ((local_1cf8.
                    super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->super_AbstractTxOutReference).
                  _vptr_AbstractTxOutReference;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x138,(char *)pp_Var8);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d30,(Message *)&local_1c88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d30);
      if ((ByteData *)local_1c88.block_height != (ByteData *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) && ((ByteData *)local_1c88.block_height != (ByteData *)0x0)) {
          (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        local_1c88.block_height)->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_start + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1cf8.
              super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
              ._M_impl.super__Vector_impl_data._M_finish,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::Txid::Txid((Txid *)local_1d30,(Txid *)(local_1cd8._0_8_ + 0x98));
    cfd::core::Txid::GetHex_abi_cxx11_((string *)&local_1c88,(Txid *)local_1d30);
    uVar5 = local_1c88.block_height;
    cfd::core::Txid::GetHex_abi_cxx11_((string *)local_1d50,&local_a10.txid);
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_1cf8,"ref_list[1].GetTxid().GetHex().c_str()",
               "utxo2.txid.GetHex().c_str()",(char *)uVar5,(char *)local_1d50._0_8_);
    if ((AssertHelperData *)local_1d50._0_8_ != pAVar1) {
      operator_delete((void *)local_1d50._0_8_);
    }
    if ((ByteData *)local_1c88.block_height != pBVar2) {
      operator_delete((void *)local_1c88.block_height);
    }
    local_1d30._0_8_ = &PTR__Txid_00723450;
    if ((void *)CONCAT71(local_1d30._9_7_,local_1d30[8]) != (void *)0x0) {
      operator_delete((void *)CONCAT71(local_1d30._9_7_,local_1d30[8]));
    }
    if (local_1cf8.
        super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>.
        _M_impl.super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_1c88);
      if (local_1cf8.
          super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>.
          _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        pp_Var8 = (_func_int **)0x616d8d;
      }
      else {
        pp_Var8 = ((local_1cf8.
                    super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->super_AbstractTxOutReference).
                  _vptr_AbstractTxOutReference;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x139,(char *)pp_Var8);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d30,(Message *)&local_1c88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d30);
      if ((ByteData *)local_1c88.block_height != (ByteData *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) && ((ByteData *)local_1c88.block_height != (ByteData *)0x0)) {
          (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        local_1c88.block_height)->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_start + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1cf8.
              super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
              ._M_impl.super__Vector_impl_data._M_finish,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::Txid::Txid((Txid *)local_1d30,(Txid *)(local_1cd8._0_8_ + 0x128));
    cfd::core::Txid::GetHex_abi_cxx11_((string *)&local_1c88,(Txid *)local_1d30);
    uVar5 = local_1c88.block_height;
    cfd::core::Txid::GetHex_abi_cxx11_((string *)local_1d50,&local_13f0.txid);
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_1cf8,"ref_list[2].GetTxid().GetHex().c_str()",
               "utxo3.txid.GetHex().c_str()",(char *)uVar5,(char *)local_1d50._0_8_);
    if ((AssertHelperData *)local_1d50._0_8_ != pAVar1) {
      operator_delete((void *)local_1d50._0_8_);
    }
    if ((ByteData *)local_1c88.block_height != pBVar2) {
      operator_delete((void *)local_1c88.block_height);
    }
    local_1d30._0_8_ = &PTR__Txid_00723450;
    if ((void *)CONCAT71(local_1d30._9_7_,local_1d30[8]) != (void *)0x0) {
      operator_delete((void *)CONCAT71(local_1d30._9_7_,local_1d30[8]));
    }
    if (local_1cf8.
        super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>.
        _M_impl.super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_1c88);
      if (local_1cf8.
          super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>.
          _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        pp_Var8 = (_func_int **)0x616d8d;
      }
      else {
        pp_Var8 = ((local_1cf8.
                    super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->super_AbstractTxOutReference).
                  _vptr_AbstractTxOutReference;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x13a,(char *)pp_Var8);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d30,(Message *)&local_1c88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d30);
      if ((ByteData *)local_1c88.block_height != (ByteData *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) && ((ByteData *)local_1c88.block_height != (ByteData *)0x0)) {
          (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        local_1c88.block_height)->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_start + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1cf8.
              super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
              ._M_impl.super__Vector_impl_data._M_finish,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::Txid::Txid((Txid *)local_1d30,(Txid *)(local_1cd8._0_8_ + 0x1b8));
    cfd::core::Txid::GetHex_abi_cxx11_((string *)&local_1c88,(Txid *)local_1d30);
    uVar5 = local_1c88.block_height;
    cfd::core::Txid::GetHex_abi_cxx11_((string *)local_1d50,&local_f00.txid);
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_1cf8,"ref_list[3].GetTxid().GetHex().c_str()",
               "utxo4.txid.GetHex().c_str()",(char *)uVar5,(char *)local_1d50._0_8_);
    if ((AssertHelperData *)local_1d50._0_8_ != pAVar1) {
      operator_delete((void *)local_1d50._0_8_);
    }
    if ((ByteData *)local_1c88.block_height != pBVar2) {
      operator_delete((void *)local_1c88.block_height);
    }
    local_1d30._0_8_ = &PTR__Txid_00723450;
    if ((void *)CONCAT71(local_1d30._9_7_,local_1d30[8]) != (void *)0x0) {
      operator_delete((void *)CONCAT71(local_1d30._9_7_,local_1d30[8]));
    }
    if (local_1cf8.
        super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>.
        _M_impl.super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_1c88);
      if (local_1cf8.
          super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>.
          _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        pp_Var8 = (_func_int **)0x616d8d;
      }
      else {
        pp_Var8 = ((local_1cf8.
                    super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->super_AbstractTxOutReference).
                  _vptr_AbstractTxOutReference;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x13b,(char *)pp_Var8);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d30,(Message *)&local_1c88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d30);
      if ((ByteData *)local_1c88.block_height != (ByteData *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) && ((ByteData *)local_1c88.block_height != (ByteData *)0x0)) {
          (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        local_1c88.block_height)->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_start + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1cf8.
              super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
              ._M_impl.super__Vector_impl_data._M_finish,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_1d30._0_4_ = *(uint32_t *)(local_1cd8._0_8_ + 0x28);
    local_1d50._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&local_1c88,"ref_list[0].GetVout()","1",(uint *)local_1d30,
               (int *)local_1d50);
    if ((char)local_1c88.block_height == '\0') {
      testing::Message::Message((Message *)local_1d30);
      if (local_1c88.block_hash._vptr_BlockHash == (_func_int **)0x0) {
        p_Var10 = (_func_int *)0x616d8d;
      }
      else {
        p_Var10 = *local_1c88.block_hash._vptr_BlockHash;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x13c,(char *)p_Var10);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d50,(Message *)local_1d30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d50);
      if ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) && ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_1d30._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1c88.block_hash,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_1d30._0_4_ = *(uint32_t *)(local_1cd8._0_8_ + 0xb8);
    local_1d50._0_4_ = 2;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&local_1c88,"ref_list[1].GetVout()","2",(uint *)local_1d30,
               (int *)local_1d50);
    if ((char)local_1c88.block_height == '\0') {
      testing::Message::Message((Message *)local_1d30);
      if (local_1c88.block_hash._vptr_BlockHash == (_func_int **)0x0) {
        p_Var10 = (_func_int *)0x616d8d;
      }
      else {
        p_Var10 = *local_1c88.block_hash._vptr_BlockHash;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x13d,(char *)p_Var10);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d50,(Message *)local_1d30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d50);
      if ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) && ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_1d30._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1c88.block_hash,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_1d30._0_4_ = *(uint32_t *)(local_1cd8._0_8_ + 0x148);
    local_1d50._0_4_ = 3;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&local_1c88,"ref_list[2].GetVout()","3",(uint *)local_1d30,
               (int *)local_1d50);
    if ((char)local_1c88.block_height == '\0') {
      testing::Message::Message((Message *)local_1d30);
      if (local_1c88.block_hash._vptr_BlockHash == (_func_int **)0x0) {
        p_Var10 = (_func_int *)0x616d8d;
      }
      else {
        p_Var10 = *local_1c88.block_hash._vptr_BlockHash;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x13e,(char *)p_Var10);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d50,(Message *)local_1d30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d50);
      if ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) && ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_1d30._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1c88.block_hash,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_1d30._0_4_ = *(uint32_t *)(local_1cd8._0_8_ + 0x1d8);
    local_1d50._0_4_ = 4;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&local_1c88,"ref_list[3].GetVout()","4",(uint *)local_1d30,
               (int *)local_1d50);
    if ((char)local_1c88.block_height == '\0') {
      testing::Message::Message((Message *)local_1d30);
      if (local_1c88.block_hash._vptr_BlockHash == (_func_int **)0x0) {
        p_Var10 = (_func_int *)0x616d8d;
      }
      else {
        p_Var10 = *local_1c88.block_hash._vptr_BlockHash;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x13f,(char *)p_Var10);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d50,(Message *)local_1d30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d50);
      if ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) && ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_1d30._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1c88.block_hash,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_1d30._0_4_ = *(uint32_t *)(local_1cd8._0_8_ + 0xf8);
    local_1d50._0_4_ = 0xf0ffffff;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&local_1c88,"ref_list[1].GetSequence()","0xf0ffffff",(uint *)local_1d30,
               (uint *)local_1d50);
    if ((char)local_1c88.block_height == '\0') {
      testing::Message::Message((Message *)local_1d30);
      if (local_1c88.block_hash._vptr_BlockHash == (_func_int **)0x0) {
        p_Var10 = (_func_int *)0x616d8d;
      }
      else {
        p_Var10 = *local_1c88.block_hash._vptr_BlockHash;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x140,(char *)p_Var10);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d50,(Message *)local_1d30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d50);
      if ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) && ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_1d30._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1c88.block_hash,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
              ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
               local_1cd8);
  }
  uVar7 = cfd::core::Transaction::GetTxOutCount(&local_1798.super_Transaction);
  puVar4 = local_1ce0;
  if (uVar7 == 2) {
    local_1d30._0_8_ = local_1d30._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&local_1c88,"indexes[0]","0",local_1ce0,(int *)local_1d30);
    if ((char)local_1c88.block_height == '\0') {
      testing::Message::Message((Message *)local_1d30);
      if (local_1c88.block_hash._vptr_BlockHash == (_func_int **)0x0) {
        p_Var10 = (_func_int *)0x616d8d;
      }
      else {
        p_Var10 = *local_1c88.block_hash._vptr_BlockHash;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x143,(char *)p_Var10);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d50,(Message *)local_1d30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d50);
      if ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) && ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_1d30._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1c88.block_hash,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_1d30._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&local_1c88,"indexes[1]","1",lhs,(int *)local_1d30);
    if ((char)local_1c88.block_height == '\0') {
      testing::Message::Message((Message *)local_1d30);
      if (local_1c88.block_hash._vptr_BlockHash == (_func_int **)0x0) {
        p_Var10 = (_func_int *)0x616d8d;
      }
      else {
        p_Var10 = *local_1c88.block_hash._vptr_BlockHash;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x144,(char *)p_Var10);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d50,(Message *)local_1d30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d50);
      if ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) && ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_1d30._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1c88.block_hash,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::Transaction::GetTxOutList(&local_1cf8,&local_1798.super_Transaction);
    cfd::core::Script::Script
              ((Script *)&local_1c88,
               (Script *)
               (CONCAT71(local_1cf8.
                         super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_1cf8.
                         super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_) + 0x18));
    cfd::core::Script::GetHex_abi_cxx11_((string *)local_1d50,(Script *)&local_1c88);
    uVar3 = local_1d50._0_8_;
    cfd::core::Address::GetLockingScript((Script *)local_1d30,(Address *)local_16e0);
    cfd::core::Script::GetHex_abi_cxx11_((string *)local_1cd8,(Script *)local_1d30);
    testing::internal::CmpHelperSTREQ
              (local_1cb8,"ref_list[0].GetLockingScript().GetHex().c_str()",
               "address1.GetLockingScript().GetHex().c_str()",(char *)uVar3,(char *)local_1cd8._0_8_
              );
    if ((pointer)local_1cd8._0_8_ != (pointer)(local_1cd8 + 0x10)) {
      operator_delete((void *)local_1cd8._0_8_);
    }
    cfd::core::Script::~Script((Script *)local_1d30);
    if ((AssertHelperData *)local_1d50._0_8_ != (AssertHelperData *)(local_1d50 + 0x10)) {
      operator_delete((void *)local_1d50._0_8_);
    }
    cfd::core::Script::~Script((Script *)&local_1c88);
    if (local_1cb8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_1c88);
      if (local_1cb0.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = ((local_1cb0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x147,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d30,(Message *)&local_1c88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d30);
      if ((ByteData *)local_1c88.block_height != (ByteData *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) && ((ByteData *)local_1c88.block_height != (ByteData *)0x0)) {
          (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        local_1c88.block_height)->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_start + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1cb0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::Script::Script
              ((Script *)&local_1c88,
               (Script *)
               (CONCAT71(local_1cf8.
                         super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_1cf8.
                         super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_) + 0x68));
    cfd::core::Script::GetHex_abi_cxx11_((string *)local_1d50,(Script *)&local_1c88);
    uVar3 = local_1d50._0_8_;
    cfd::core::Address::GetLockingScript((Script *)local_1d30,&local_1568);
    cfd::core::Script::GetHex_abi_cxx11_((string *)local_1cd8,(Script *)local_1d30);
    testing::internal::CmpHelperSTREQ
              (local_1cb8,"ref_list[1].GetLockingScript().GetHex().c_str()",
               "address2.GetLockingScript().GetHex().c_str()",(char *)uVar3,(char *)local_1cd8._0_8_
              );
    if ((pointer)local_1cd8._0_8_ != (pointer)(local_1cd8 + 0x10)) {
      operator_delete((void *)local_1cd8._0_8_);
    }
    cfd::core::Script::~Script((Script *)local_1d30);
    if ((AssertHelperData *)local_1d50._0_8_ != (AssertHelperData *)(local_1d50 + 0x10)) {
      operator_delete((void *)local_1d50._0_8_);
    }
    cfd::core::Script::~Script((Script *)&local_1c88);
    if (local_1cb8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_1c88);
      if (local_1cb0.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = ((local_1cb0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x149,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d30,(Message *)&local_1c88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d30);
      if ((ByteData *)local_1c88.block_height != (ByteData *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) && ((ByteData *)local_1c88.block_height != (ByteData *)0x0)) {
          (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        local_1c88.block_height)->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_start + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1cb0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_1d30._0_8_ =
         *(undefined8 *)
          (CONCAT71(local_1cf8.
                    super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                    local_1cf8.
                    super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                    ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8);
    local_1d30[8] =
         *(undefined1 *)
          (CONCAT71(local_1cf8.
                    super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                    local_1cf8.
                    super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                    ._M_impl.super__Vector_impl_data._M_start._0_1_) + 0x10);
    local_1d50._0_8_ = cfd::core::Amount::GetCoinValue((Amount *)local_1d30);
    local_1cd8._0_8_ = (pointer)0x3fb999999999999a;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&local_1c88,"ref_list[0].GetValue().GetCoinValue()","0.1",
               (double *)local_1d50,(double *)local_1cd8);
    if ((char)local_1c88.block_height == '\0') {
      testing::Message::Message((Message *)local_1d30);
      if (local_1c88.block_hash._vptr_BlockHash == (_func_int **)0x0) {
        p_Var10 = (_func_int *)0x616d8d;
      }
      else {
        p_Var10 = *local_1c88.block_hash._vptr_BlockHash;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x14a,(char *)p_Var10);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d50,(Message *)local_1d30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d50);
      if ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) && ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_1d30._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1c88.block_hash,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_1d30._0_8_ =
         *(undefined8 *)
          (CONCAT71(local_1cf8.
                    super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                    local_1cf8.
                    super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                    ._M_impl.super__Vector_impl_data._M_start._0_1_) + 0x58);
    local_1d30[8] =
         *(undefined1 *)
          (CONCAT71(local_1cf8.
                    super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                    local_1cf8.
                    super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                    ._M_impl.super__Vector_impl_data._M_start._0_1_) + 0x60);
    local_1d50._0_8_ = cfd::core::Amount::GetCoinValue((Amount *)local_1d30);
    local_1cd8._0_8_ = (pointer)0x3f847ae147ae147b;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&local_1c88,"ref_list[1].GetValue().GetCoinValue()","0.01",
               (double *)local_1d50,(double *)local_1cd8);
    if ((char)local_1c88.block_height == '\0') {
      testing::Message::Message((Message *)local_1d30);
      if (local_1c88.block_hash._vptr_BlockHash == (_func_int **)0x0) {
        p_Var10 = (_func_int *)0x616d8d;
      }
      else {
        p_Var10 = *local_1c88.block_hash._vptr_BlockHash;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x14b,(char *)p_Var10);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d50,(Message *)local_1d30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d50);
      if ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) && ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_1d30._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1c88.block_hash,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
              (&local_1cf8);
  }
  cfd::UtxoData::UtxoData(&local_1c88);
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    cfd::TransactionContext::AddInput(&local_1798,&local_1c88);
  }
  testing::Message::Message((Message *)local_1d30);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_1d50,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
             ,0x14f,
             "Expected: ctx.AddInput(utxo_stub) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_1d50,(Message *)local_1d30);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d50);
  if ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0) {
    bVar6 = testing::internal::IsTrue(true);
    if ((bVar6) && ((AssertHelperData *)local_1d30._0_8_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_1d30._0_8_ + 8))();
    }
  }
  cfd::UtxoData::~UtxoData(&local_1c88);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_1568.format_data_);
  cfd::core::Script::~Script(&local_1568.redeem_script_);
  local_1568.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_1568.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_1568.script_tree_.super_TapBranch);
  if (local_1568.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1568.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1568.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1568.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1568.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1568.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1568.address_._M_dataplus._M_p != &local_1568.address_.field_2) {
    operator_delete(local_1568.address_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1598);
  cfd::core::Script::~Script(&local_15d8);
  local_1668._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_15f0)
  ;
  cfd::core::TapBranch::~TapBranch(&local_1668);
  if (local_1680 != (pointer)0x0) {
    operator_delete(local_1680);
  }
  if (local_1698 != (pointer)0x0) {
    operator_delete(local_1698);
  }
  if (local_16b0 != (pointer)0x0) {
    operator_delete(local_16b0);
  }
  if ((undefined1 *)local_16e0._16_8_ != local_16c0) {
    operator_delete((void *)local_16e0._16_8_);
  }
  operator_delete(puVar4);
  cfd::TransactionContext::~TransactionContext(&local_1798);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_1ca8);
  cfd::UtxoData::~UtxoData(&local_f00);
  cfd::UtxoData::~UtxoData(&local_13f0);
  cfd::UtxoData::~UtxoData(&local_a10);
  cfd::UtxoData::~UtxoData(&local_520);
  return;
}

Assistant:

TEST(TransactionContext, Input_Output) {
  // input-output test
  UtxoData utxo1;
  utxo1.txid = Txid("9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a");
  utxo1.vout = 1;
  utxo1.address_type = AddressType::kP2wpkhAddress;
  UtxoData utxo2;
  utxo2.txid = Txid("8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a");
  utxo2.vout = 2;
  utxo2.address_type = AddressType::kP2wpkhAddress;
  UtxoData utxo3;
  utxo3.txid = Txid("b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b");
  utxo3.vout = 3;
  utxo3.address_type = AddressType::kP2wpkhAddress;
  UtxoData utxo4;
  utxo4.txid = Txid("0f093988839178ea5895431241cb4400fb31dd7b665a1a93cbd372336c717e0c");
  utxo4.vout = 4;
  utxo4.address_type = AddressType::kP2wpkhAddress;
  std::vector<UtxoData> utxos;
  utxos.push_back(utxo3);
  utxos.push_back(utxo4);

  TransactionContext ctx(2, 0);

  EXPECT_NO_THROW(ctx.AddInput(utxo1));
  EXPECT_NO_THROW(ctx.AddInput(utxo2, 0xf0ffffff));
  EXPECT_NO_THROW(ctx.AddInputs(utxos));
  std::vector<uint32_t> indexes(2);
  Address address1("3K4cCA6U45jhvBcgc8qEdjHGDGyUMuVRpG");
  Address address2("bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q");
  EXPECT_NO_THROW(indexes[0] = ctx.AddTxOut(address1, Amount(0.1)));
  EXPECT_NO_THROW(indexes[1] = ctx.AddTxOut(address2, Amount(0.01)));

  EXPECT_EQ(ctx.GetTxInCount(), 4);
  EXPECT_EQ(ctx.GetTxOutCount(), 2);
  EXPECT_EQ(ctx.GetSizeIgnoreTxIn(), 75);
  EXPECT_EQ(ctx.GetVsizeIgnoreTxIn(), 75);
  if (ctx.GetTxInCount() == 4) {
    auto ref_list = ctx.GetTxInList();
    EXPECT_STREQ(ref_list[0].GetTxid().GetHex().c_str(), utxo1.txid.GetHex().c_str());
    EXPECT_STREQ(ref_list[1].GetTxid().GetHex().c_str(), utxo2.txid.GetHex().c_str());
    EXPECT_STREQ(ref_list[2].GetTxid().GetHex().c_str(), utxo3.txid.GetHex().c_str());
    EXPECT_STREQ(ref_list[3].GetTxid().GetHex().c_str(), utxo4.txid.GetHex().c_str());
    EXPECT_EQ(ref_list[0].GetVout(), 1);
    EXPECT_EQ(ref_list[1].GetVout(), 2);
    EXPECT_EQ(ref_list[2].GetVout(), 3);
    EXPECT_EQ(ref_list[3].GetVout(), 4);
    EXPECT_EQ(ref_list[1].GetSequence(), 0xf0ffffff);
  }
  if (ctx.GetTxOutCount() == 2) {
    EXPECT_EQ(indexes[0], 0);
    EXPECT_EQ(indexes[1], 1);
    auto ref_list = ctx.GetTxOutList();
    EXPECT_STREQ(ref_list[0].GetLockingScript().GetHex().c_str(),
                 address1.GetLockingScript().GetHex().c_str());
    EXPECT_STREQ(ref_list[1].GetLockingScript().GetHex().c_str(),
                 address2.GetLockingScript().GetHex().c_str());
    EXPECT_EQ(ref_list[0].GetValue().GetCoinValue(), 0.1);
    EXPECT_EQ(ref_list[1].GetValue().GetCoinValue(), 0.01);
  }

  UtxoData utxo_stub;
  EXPECT_THROW(ctx.AddInput(utxo_stub), CfdException);
}